

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

void __thiscall cmSourceFile::CheckExtension(cmSourceFile *this)

{
  string *ext;
  int iVar1;
  string realExt;
  string local_58;
  string local_38;
  
  cmsys::SystemTools::GetFilenameLastExtension(&local_38,&this->FullPath);
  if (local_38._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_38);
    std::__cxx11::string::operator=((string *)&this->Extension,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  ext = &this->Extension;
  iVar1 = std::__cxx11::string::compare((char *)ext);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)ext);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)ext);
      if (iVar1 != 0) goto LAB_00295b17;
    }
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"EXTERNAL_OBJECT","");
  SetProperty(this,&local_58,"1");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
LAB_00295b17:
  if ((this->Language)._M_string_length == 0) {
    CheckLanguage(this,ext);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmSourceFile::CheckExtension()
{
  // Compute the extension.
  std::string realExt =
    cmSystemTools::GetFilenameLastExtension(this->FullPath);
  if (!realExt.empty()) {
    // Store the extension without the leading '.'.
    this->Extension = realExt.substr(1);
  }

  // Look for object files.
  if (this->Extension == "obj" || this->Extension == "o" ||
      this->Extension == "lo") {
    this->SetProperty("EXTERNAL_OBJECT", "1");
  }

  // Try to identify the source file language from the extension.
  if (this->Language.empty()) {
    this->CheckLanguage(this->Extension);
  }
}